

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgTree.cpp
# Opt level: O2

dgRedBackNode * __thiscall dgRedBackNode::Next(dgRedBackNode *this)

{
  dgRedBackNode *pdVar1;
  bool bVar2;
  
  if (this->m_right != (dgRedBackNode *)0x0) {
    pdVar1 = Minimum(this->m_right);
    return pdVar1;
  }
  do {
    pdVar1 = this->m_parent;
    if (pdVar1 == (dgRedBackNode *)0x0) {
      return (dgRedBackNode *)0x0;
    }
    bVar2 = this == pdVar1->m_right;
    this = pdVar1;
  } while (bVar2);
  return pdVar1;
}

Assistant:

dgRedBackNode *dgRedBackNode::Next () const
{

	if (m_right) {
		return m_right->Minimum ();
	}

	dgRedBackNode* node = (dgRedBackNode *)this;
	dgRedBackNode* ptr = m_parent;
	for (; ptr && node == ptr->m_right; ptr = ptr->m_parent) {
		node = ptr;
	}
	return ptr;
}